

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void Fixpp::impl::
     visitMessage<Fixpp::impl::MessageVisitor<should_visit_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context)

{
  char *pcVar1;
  VisitStatus VVar2;
  size_type *local_50;
  string msgTypeStr;
  string versionStr;
  
  VVar2 = visitDictionary<Fixpp::v42::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_visit_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
                    ();
  if (VVar2 == NotFound) {
    pcVar1 = (context->version).first;
    msgTypeStr.field_2._8_8_ = &versionStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&msgTypeStr.field_2 + 8),pcVar1,pcVar1 + (context->version).second);
    pcVar1 = (context->msgType).first;
    local_50 = &msgTypeStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar1,pcVar1 + (context->msgType).second);
    ParsingContext::setError
              (context,UnknownMessage,"Unknown MsgType(%s) for FIX version %s",local_50,
               msgTypeStr.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    if (VVar2 != VersionMismatch) {
      return;
    }
    pcVar1 = (context->version).first;
    msgTypeStr.field_2._8_8_ = &versionStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&msgTypeStr.field_2 + 8),pcVar1,pcVar1 + (context->version).second);
    ParsingContext::setError
              (context,InvalidVersion,"FIX version mismatched, expected \'%s\', got \'%s\'",
               "FIX.4.2",msgTypeStr.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)(msgTypeStr.field_2._M_local_buf + 8));
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
        {

            using Dictionary = typename Rules::Dictionary;
            using Version = typename Dictionary::Version;

            auto status = visitDictionary<Dictionary>(context, visitor, rules);

            if (status == VisitStatus::VersionMismatch)
            {
                std::string versionStr(context.version.first, context.version.second);

                context.setError(ErrorKind::InvalidVersion, "FIX version mismatched, expected '%s', got '%s'",
                        Version::Str, versionStr.c_str());
            }
            else if (status == VisitStatus::NotFound)
            {
                std::string versionStr(context.version.first, context.version.second);
                std::string msgTypeStr(context.msgType.first, context.msgType.second);

                context.setError(ErrorKind::UnknownMessage, "Unknown MsgType(%s) for FIX version %s", msgTypeStr.c_str(), versionStr.c_str());
            }
        }